

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O3

int __thiscall
SatPos::CalculateSatVel
          (SatPos *this,long *Eph,int flag,undefined8 param_4,undefined8 param_5,undefined8 param_6)

{
  int iVar1;
  ulong uVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  SatPos *pSVar9;
  double *pdVar10;
  long lVar11;
  XYZ *pXVar12;
  byte bVar13;
  double dVar14;
  Vector3d velocity;
  undefined8 local_1440 [600];
  double local_180;
  undefined1 local_173;
  undefined1 local_172;
  byte local_171;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_140;
  undefined4 local_134;
  double local_130;
  double local_128;
  int local_11c;
  Matrix<double,_3,_1> local_118;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  Matrix<double,_3,_4> local_d0;
  Satellite *local_c0;
  SatPos *local_b8;
  long local_b0;
  ulong local_a8;
  long *local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  Matrix<double,_4,_1> local_40;
  
  bVar13 = 0;
  local_173 = flag != 0;
  if (flag == 0) {
    uVar2 = 0x20;
    local_e0 = 7.2921151467e-05;
    pSVar9 = this;
  }
  else {
    if (flag != 4) {
      return -2;
    }
    uVar2 = 0x40;
    local_e0 = 7.292115e-05;
    pSVar9 = (SatPos *)this->Bds;
  }
  local_c0 = this->Bds;
  pdVar10 = &pSVar9->Gps[0].n;
  pXVar12 = &this->Bds[0].GK;
  lVar4 = uVar2 * 0xd8;
  local_172 = true;
  uVar5 = 1;
  lVar11 = 0;
  lVar6 = 0;
  local_11c = flag;
  local_b8 = this;
  local_b0 = lVar4;
  local_a8 = uVar2;
  local_a0 = Eph;
  do {
    local_108 = *pdVar10;
    if ((local_108 != -1.0) || (NAN(local_108))) {
      local_170 = *(double *)(*Eph + 0x30 + lVar11);
      local_180 = pdVar10[-8];
      dVar14 = cos(pdVar10[-7]);
      local_108 = local_108 / (1.0 - dVar14 * local_170);
      if (local_11c == 0) {
        pdVar3 = &pXVar12[-0xf0].X;
LAB_0010b6d3:
        *pdVar3 = local_108;
        local_134 = (undefined4)CONCAT71((int7)((ulong)pdVar3 >> 8),local_173);
      }
      else {
        if (local_11c == 4) {
          pdVar3 = &local_c0[lVar6].Ekdot;
          goto LAB_0010b6d3;
        }
        local_134 = 0;
      }
      dVar14 = *(double *)(*Eph + 0x30 + lVar11);
      dVar14 = (dVar14 + 1.0) / (1.0 - dVar14);
      if (dVar14 < 0.0) {
        local_128 = sqrt(dVar14);
      }
      else {
        local_128 = SQRT(dVar14);
      }
      local_170 = cos(pdVar10[-9] * 0.5);
      dVar14 = cos(pdVar10[-7] * 0.5);
      local_128 = local_128 * (local_170 / dVar14) * (local_170 / dVar14) * local_108;
      local_130 = *(double *)(*Eph + 0x50 + lVar11);
      local_180 = local_180 + local_180;
      local_170 = cos(local_180);
      local_160 = *(double *)(*Eph + 0x48 + lVar11);
      local_140 = sin(local_180);
      dVar14 = *(double *)(*Eph + 0x38 + lVar11);
      local_50 = dVar14 * dVar14 * *(double *)(*Eph + 0x30 + lVar11);
      local_58 = sin(pdVar10[-7]);
      local_f0 = *(double *)(*Eph + 0x60 + lVar11);
      local_60 = cos(local_180);
      local_68 = *(double *)(*Eph + 0x58 + lVar11);
      local_70 = sin(local_180);
      local_158 = *(double *)(*Eph + 0x70 + lVar11);
      local_e8 = cos(local_180);
      local_168 = *(double *)(*Eph + 0x68 + lVar11);
      dVar14 = sin(local_180);
      dVar14 = local_e8 * local_158 - dVar14 * local_168;
      local_e8 = (dVar14 + dVar14) * local_128 + *(double *)(*Eph + 0x80 + lVar11);
      local_d8 = *(double *)(*Eph + 0x90 + lVar11);
      iVar1 = (int)uVar5;
      local_171 = iVar1 - 0x3bU < 0xffffffcb & (byte)local_134;
      if (local_171 == 0) {
        local_d8 = local_d8 - local_e0;
      }
      dVar14 = local_130 * local_170 - local_140 * local_160;
      local_130 = (dVar14 + dVar14) * local_128 + local_128;
      local_140 = pdVar10[-4];
      local_168 = cos(pdVar10[-5]);
      local_160 = pdVar10[-4];
      local_f8 = sin(pdVar10[-5]);
      local_78 = cos(pdVar10[-5]);
      local_80 = pdVar10[-4] * local_130;
      local_88 = sin(pdVar10[-5]);
      local_90 = sin(pdVar10[-5]);
      local_130 = local_130 * pdVar10[-4];
      local_98 = cos(pdVar10[-5]);
      local_170 = pdVar10[-3];
      local_180 = pdVar10[-2];
      local_d0.rows = 3;
      local_d0.cols = 4;
      local_d0.data = (double *)operator_new__(0x60);
      local_158 = cos(local_180);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d0,0,0);
      *pdVar3 = local_158;
      local_158 = sin(local_180);
      local_100 = cos(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d0,0,1);
      *pdVar3 = local_100 * -local_158;
      local_158 = sin(local_180);
      local_100 = cos(local_180);
      local_48 = cos(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d0,0,2);
      local_140 = local_140 * local_168;
      local_160 = local_160 * local_f8;
      *pdVar3 = -(local_158 * local_140 + local_100 * local_160 * local_48);
      local_158 = sin(local_180);
      local_168 = sin(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d0,0,3);
      *pdVar3 = local_158 * local_160 * local_168;
      local_158 = sin(local_180);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d0,1,0);
      *pdVar3 = local_158;
      local_158 = cos(local_180);
      local_168 = cos(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d0,1,1);
      *pdVar3 = local_158 * local_168;
      local_158 = cos(local_180);
      local_168 = sin(local_180);
      local_f8 = cos(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d0,1,2);
      *pdVar3 = local_140 * local_158 - local_168 * local_160 * local_f8;
      local_180 = cos(local_180);
      local_140 = sin(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d0,1,3);
      *pdVar3 = local_180 * local_160 * local_140;
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d0,2,0);
      *pdVar3 = 0.0;
      local_180 = sin(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d0,2,1);
      *pdVar3 = local_180;
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d0,2,2);
      *pdVar3 = 0.0;
      local_180 = cos(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d0,2,3);
      *pdVar3 = local_160 * local_180;
      local_40.rows = 4;
      local_40.cols = 1;
      local_40.data = (double *)operator_new__(0x20);
      pdVar3 = Matrix<double,_4,_1>::operator()(&local_40,0,0);
      dVar14 = local_f0 * local_60 - local_70 * local_68;
      local_f0 = (dVar14 + dVar14) * local_128 + local_108 * local_50 * local_58;
      *pdVar3 = local_78 * local_f0 - local_80 * local_88;
      pdVar3 = Matrix<double,_4,_1>::operator()(&local_40,1,0);
      *pdVar3 = local_f0 * local_90 + local_130 * local_98;
      pdVar3 = Matrix<double,_4,_1>::operator()(&local_40,2,0);
      *pdVar3 = local_d8;
      pdVar3 = Matrix<double,_4,_1>::operator()(&local_40,3,0);
      *pdVar3 = local_e8;
      local_118 = Matrix<double,3,4>::operator*((Matrix<double,3,4> *)&local_d0,&local_40);
      Eph = local_a0;
      if (local_11c == 0) {
        pdVar3 = Matrix<double,_3,_1>::operator()(&local_118,0,0);
        *(double *)((long)(pXVar12 + -0xf7) + 0x10) = *pdVar3;
        pdVar3 = Matrix<double,_3,_1>::operator()(&local_118,1,0);
        pXVar12[-0xf6].X = *pdVar3;
        pdVar3 = Matrix<double,_3,_1>::operator()(&local_118,2,0);
        *(double *)((long)(pXVar12 + -0xf6) + 8) = *pdVar3;
      }
      if (local_171 == 0) {
        if ((char)local_134 == '\x01' && iVar1 - 6U < 0x35) {
          pdVar3 = Matrix<double,_3,_1>::operator()(&local_118,0,0);
          pXVar12[-1].X = *pdVar3;
          pdVar3 = Matrix<double,_3,_1>::operator()(&local_118,1,0);
          pXVar12[-1].Y = *pdVar3;
          pdVar3 = Matrix<double,_3,_1>::operator()(&local_118,2,0);
          pXVar12[-1].Z = *pdVar3;
        }
      }
      else {
        pSVar9 = (SatPos *)pdVar10[-6];
        puVar7 = (undefined8 *)&stack0x00000008;
        puVar8 = local_1440;
        for (lVar4 = 599; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar8 = *puVar7;
          puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
          puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
        }
        CalculateGEOVel(pSVar9,local_b8,iVar1 + -1,local_118._0_8_,local_118.data,iVar1 + -1,param_6
                        ,pXVar12->X,pXVar12->Y,pXVar12->Z);
      }
      if (local_118.data != (double *)0x0) {
        operator_delete__(local_118.data);
      }
      if (local_40.data != (double *)0x0) {
        operator_delete__(local_40.data);
      }
      uVar2 = local_a8;
      lVar4 = local_b0;
      if (local_d0.data != (double *)0x0) {
        operator_delete__(local_d0.data);
        uVar2 = local_a8;
        lVar4 = local_b0;
      }
    }
    lVar6 = lVar6 + 1;
    local_172 = uVar5 < uVar2;
    uVar5 = uVar5 + 1;
    lVar11 = lVar11 + 0xd8;
    pdVar10 = pdVar10 + 0x17;
    pXVar12 = (XYZ *)((long)(pXVar12 + 7) + 0x10);
    if (lVar4 == lVar11) {
      return 0;
    }
  } while( true );
}

Assistant:

int SatPos::CalculateSatVel(Ephemeris* &&Eph, const NavSys flag, SPPResult result)
{
    int maxprn;
    double RotationRate;
    Satellite* param;

    if(flag == GPS)
    {
        maxprn = MAXGPSSRN;
        RotationRate = GPSROTATIONRATE;
        param = this->Gps;
    }
    else if(flag == BDS)
    {
        maxprn = MAXBDSSRN;
        RotationRate = BDSROTATIONRATE;
        param = this->Bds;
    }
    else
        return UNSUPPORTED_MSG;

    for(int prn = 0; prn < maxprn; ++prn)
    {
        if(param[prn].n == -1)
            continue;

        try
        {   
            // temp
            double phik = param[prn].phik;
            double Ekdot = param[prn].n / (1 - Eph[prn].ecc * cos(param[prn].Ek));
            if(flag == GPS)
                this->Gps[prn].Ekdot = Ekdot;
            if(flag == BDS)
                this->Bds[prn].Ekdot = Ekdot;

            // temp param, to calculate long equation
            double left = sqrt((1 + Eph[prn].ecc) / (1 - Eph[prn].ecc));
            double right = cos(param[prn].vk / 2.0) / cos(param[prn].Ek / 2.0);
            double Phikdot = left * right * right * Ekdot;

            left = Eph[prn].cus * cos(2 * phik) - Eph[prn].cuc * sin(2 * phik);
            double ukdot = 2 * left * Phikdot + Phikdot;

            left = Eph[prn].sqrtA * Eph[prn].sqrtA * Eph[prn].ecc * sin(param[prn].Ek) * Ekdot;
            right = 2 * (Eph[prn].crs * cos(2 * phik) - Eph[prn].crc * sin(2 * phik));
            double rkdot = left + right * Phikdot;

            right = 2 * (Eph[prn].cis * cos(2 * phik) - Eph[prn].cic * sin(2 * phik));
            double Ikdot = Eph[prn].I0Rate + right * Phikdot;

            double Omegakdot = Eph[prn].omegaORate - RotationRate;

            if(flag == BDS && (prn < 5 || prn >= 58))
                Omegakdot = Eph[prn].omegaORate;
            
            double XK = param[prn].rk * cos(param[prn].uk);
            double YK = param[prn].rk * sin(param[prn].uk);
            double XKdot = rkdot * cos(param[prn].uk) - param[prn].rk * ukdot * sin(param[prn].uk);
            double YKdot = rkdot * sin(param[prn].uk) + param[prn].rk * ukdot * cos(param[prn].uk);

            // temp
            double Omegak = param[prn].Omegak;
            double ik = param[prn].ik;

            Matrix<double, 3, 4> Rdot;
            Rdot(0, 0) = cos(Omegak);
            Rdot(0, 1) = -sin(Omegak) * cos(ik);
            Rdot(0, 2) = -(XK * sin(Omegak) + YK * cos(Omegak) * cos(ik));
            Rdot(0, 3) = YK * sin(Omegak) * sin(ik);

            Rdot(1, 0) = sin(Omegak);
            Rdot(1, 1) = cos(Omegak) * cos(ik);
            Rdot(1, 2) = XK * cos(Omegak) - YK * sin(Omegak) * cos(ik);
            Rdot(1, 3) = YK * cos(Omegak) * sin(ik);

            Rdot(2, 0) = 0;
            Rdot(2, 1) = sin(ik);
            Rdot(2, 2) = 0;
            Rdot(2, 3) = YK * cos(ik);
            
            Matrix<double, 4, 1> p;
            p(0, 0) = XKdot;
            p(1, 0) = YKdot;
            p(2, 0) = Omegakdot;
            p(3, 0) = Ikdot;

            Vector3d velocity = Rdot * p;
            if(flag == GPS)
            {
                // 有些累赘  其实可以不用XYZ来存储
                // 可以全部存储为Matrix数据
                Gps[prn].SatVelocity.X = velocity(0, 0);
                Gps[prn].SatVelocity.Y = velocity(1, 0);
                Gps[prn].SatVelocity.Z = velocity(2, 0);
            }
            if(flag == BDS && (prn <5 || prn >= 58))
            {
                CalculateGEOVel(param[prn].tk, Bds[prn].GK, prn, velocity, result);
            }
            if(flag == BDS && (prn >= 5 && prn < 58))
            {
                Bds[prn].SatVelocity.X = velocity(0, 0);
                Bds[prn].SatVelocity.Y = velocity(1, 0);
                Bds[prn].SatVelocity.Z = velocity(2, 0);
            }
            // cout << Bds[prn].SatPosition << endl;

            velocity.deleteMatrix();
            p.deleteMatrix();
            Rdot.deleteMatrix();
        }
        catch(...)
        {
            cout << "error happened when calculate satellite velocity" << endl;
            return UNKNOWN_ERROR;
        }
        
    }
    return 0;
}